

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O1

int FeederBigParabol(void)

{
  DWORD DVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DWORD DVar6;
  uint uVar7;
  FILE *__stream;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
LAB_00102f6b:
    puts("can\'t create in.txt. No space on disk?");
    iVar4 = -1;
  }
  else {
    printf("Creating big parabol... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",100000);
    lVar12 = 0x61a9;
    lVar13 = -0x61a9;
    do {
      iVar4 = 0;
      if (bigParabolsN - 1U < 4) {
        lVar8 = lVar12 + -25000;
        iVar4 = (int)lVar8;
        switch(bigParabolsN) {
        case 1:
          uVar9 = (ulong)(uint)(iVar4 * iVar4) | 0xffffffff80000000;
          iVar4 = fprintf(__stream,"%lld %lld\n",lVar8,uVar9);
          iVar3 = fprintf(__stream,"%lld %lld\n",lVar13 + 25000,uVar9);
          lVar8 = lVar12 * lVar12 + -0x80000000;
          iVar5 = fprintf(__stream,"%lld %lld\n",lVar12,lVar8);
          iVar2 = fprintf(__stream,"%lld %lld\n",lVar13,lVar8);
          iVar4 = iVar2 + iVar5 + iVar3 + iVar4;
          goto LAB_00102eec;
        case 2:
          lVar10 = lVar8 * (lVar13 + 25000) + 0x7fffffff;
          iVar3 = fprintf(__stream,"%lld %lld\n",lVar8,lVar10);
          iVar4 = fprintf(__stream,"%lld %lld\n",lVar13 + 25000,lVar10);
          iVar4 = iVar4 + iVar3;
          lVar11 = lVar13 * lVar12 + 0x7fffffff;
          iVar3 = fprintf(__stream,"%lld %lld\n",lVar12,lVar11);
          lVar10 = lVar13;
          break;
        case 3:
          uVar9 = (ulong)(uint)(iVar4 * iVar4) | 0xffffffff80000000;
          iVar3 = fprintf(__stream,"%lld %lld\n",uVar9,lVar8);
          iVar4 = fprintf(__stream,"%lld %lld\n",uVar9,lVar13 + 25000);
          iVar4 = iVar4 + iVar3;
          lVar10 = lVar12 * lVar12 + -0x80000000;
          iVar3 = fprintf(__stream,"%lld %lld\n",lVar10,lVar12);
          lVar11 = lVar13;
          break;
        case 4:
          iVar3 = fprintf(__stream,"%lld %lld\n",lVar8,lVar8 * lVar8);
          lVar10 = lVar13 + 25000;
          iVar4 = fprintf(__stream,"%lld %lld\n",lVar10,lVar8 * lVar8);
          iVar4 = iVar4 + iVar3;
          lVar11 = lVar8 * lVar10;
          iVar3 = fprintf(__stream,"%lld %lld\n",lVar8,lVar11);
        }
        iVar5 = fprintf(__stream,"%lld %lld\n",lVar10,lVar11);
        iVar4 = iVar5 + iVar3 + iVar4;
      }
LAB_00102eec:
      if (iVar4 < 4) {
        fclose(__stream);
        goto LAB_00102f6b;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar12 != 0xc351);
    DVar6 = GetTickCount();
    uVar7 = RoundUptoThousand(DVar6 - DVar1);
    iVar4 = 0;
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ",(ulong)uVar7 / 1000);
    LabTimeout = uVar7 * 2 + 2000;
    LabMemoryLimit = 1;
    fflush(_stdout);
    fclose(__stream);
  }
  return iVar4;
}

Assistant:

static int FeederBigParabol(void)
{
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    printf("Creating big parabol... ");
    fflush(stdout);
    DWORD t = GetTickCount();
    fprintf(in, "%d\n", MAX_POINT_COUNT);

    for (long long i = 1; i <= MAX_POINT_COUNT / 4; ++i) {
        int printCount = 0;
        if (bigParabolsN == 1) {
            printCount += fprintf(in, "%lld %lld\n", i, i*i + INT_MIN);
            printCount += fprintf(in, "%lld %lld\n", -i, i*i + INT_MIN);
            i += MAX_POINT_COUNT / 4;
            printCount += fprintf(in, "%lld %lld\n", i, i*i + INT_MIN);
            printCount += fprintf(in, "%lld %lld\n", -i, i*i + INT_MIN);
            i -= MAX_POINT_COUNT / 4;
        }
        else if (bigParabolsN == 2) {
            printCount += fprintf(in, "%lld %lld\n", i, -i*i + INT_MAX);
            printCount += fprintf(in, "%lld %lld\n", -i, -i*i + INT_MAX);
            i += MAX_POINT_COUNT / 4;
            printCount += fprintf(in, "%lld %lld\n", i, -i*i + INT_MAX);
            printCount += fprintf(in, "%lld %lld\n", -i, -i*i + INT_MAX);
            i -= MAX_POINT_COUNT / 4;
        }
        else if (bigParabolsN == 3) {
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, i);
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, -i);
            i += MAX_POINT_COUNT / 4;
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, i);
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, -i);
            i -= MAX_POINT_COUNT / 4;
        }
        else if (bigParabolsN == 4) {
            printCount += fprintf(in, "%lld %lld\n", i, i*i);
            printCount += fprintf(in, "%lld %lld\n", -i, i*i);
            printCount += fprintf(in, "%lld %lld\n", i, -i*i);
            printCount += fprintf(in, "%lld %lld\n", -i, -i*i);
        }

        if (printCount < 4) {
            fclose(in);
            printf("can't create in.txt. No space on disk?\n");
            return -1;
        }
    }

    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+2000;
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES + 3*sizeof(TPoint)*MAX_POINT_COUNT;
    fflush(stdout);
    fclose(in);

    return 0;    
}